

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall
c4::basic_substring<const_char>::find
          (basic_substring<const_char> *this,ro_substr pattern,size_t start_pos)

{
  char *pcVar1;
  ulong uVar2;
  code *pcVar3;
  long lVar4;
  bool bVar5;
  error_flags eVar6;
  size_t sVar7;
  ulong uVar8;
  size_t i;
  ulong uVar9;
  
  uVar8 = pattern.len;
  uVar2 = this->len;
  if (uVar2 < start_pos && start_pos != 0xffffffffffffffff) {
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar3 = (code *)swi(3);
      sVar7 = (*pcVar3)();
      return sVar7;
    }
    handle_error(0x1e5106,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x160a,"start_pos == npos || (start_pos >= 0 && start_pos <= len)");
  }
  if (uVar8 <= uVar2) {
    for (; start_pos < (uVar2 - uVar8) + 1; start_pos = start_pos + 1) {
      uVar9 = 0;
      do {
        if (uVar8 == uVar9) {
          return start_pos;
        }
        if (this->len <= start_pos + uVar9) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar3 = (code *)swi(3);
            sVar7 = (*pcVar3)();
            return sVar7;
          }
          handle_error(0x1e5106,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1611,"i + j < len");
        }
        lVar4 = uVar9 + start_pos;
        pcVar1 = pattern.str + uVar9;
        uVar9 = uVar9 + 1;
      } while (this->str[lVar4] == *pcVar1);
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

inline size_t find(ro_substr pattern, size_t start_pos=0) const
    {
        C4_ASSERT(start_pos == npos || (start_pos >= 0 && start_pos <= len));
        if(len < pattern.len) return npos;
        for(size_t i = start_pos, e = len - pattern.len + 1; i < e; ++i)
        {
            bool gotit = true;
            for(size_t j = 0; j < pattern.len; ++j)
            {
                C4_ASSERT(i + j < len);
                if(str[i + j] != pattern.str[j])
                {
                    gotit = false;
                    break;
                }
            }
            if(gotit)
            {
                return i;
            }
        }
        return npos;
    }